

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall
FormatTest_WideFormatToN_Test::~FormatTest_WideFormatToN_Test(FormatTest_WideFormatToN_Test *this)

{
  void *in_RDI;
  
  ~FormatTest_WideFormatToN_Test((FormatTest_WideFormatToN_Test *)0x1a0798);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(FormatTest, WideFormatToN) {
  wchar_t buffer[4];
  buffer[3] = L'x';
  auto result = fmt::format_to_n(buffer, 3, L"{}", 12345);
  EXPECT_EQ(5u, result.size);
  EXPECT_EQ(buffer + 3, result.out);
  EXPECT_EQ(L"123x", fmt::wstring_view(buffer, 4));
}